

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

edge_t_conflict
create_edge(gen_ctx_t gen_ctx,bb_t_conflict src,bb_t_conflict dst,int fall_through_p,int append_p)

{
  in_edge_t_conflict elem;
  edge_t_conflict e;
  int append_p_local;
  int fall_through_p_local;
  bb_t_conflict dst_local;
  bb_t_conflict src_local;
  gen_ctx_t gen_ctx_local;
  
  elem = (in_edge_t_conflict)gen_malloc(gen_ctx,0x38);
  elem->src = src;
  elem->dst = dst;
  if (append_p == 0) {
    DLIST_in_edge_t_prepend(&dst->in_edges,elem);
    DLIST_out_edge_t_prepend(&src->out_edges,elem);
  }
  else {
    DLIST_in_edge_t_append(&dst->in_edges,elem);
    DLIST_out_edge_t_append(&src->out_edges,elem);
  }
  elem->fall_through_p = (uchar)fall_through_p;
  elem->flag2 = '\0';
  elem->flag1 = '\0';
  elem->back_edge_p = '\0';
  return elem;
}

Assistant:

static edge_t create_edge (gen_ctx_t gen_ctx, bb_t src, bb_t dst, int fall_through_p,
                           int append_p) {
  edge_t e = gen_malloc (gen_ctx, sizeof (struct edge));

  e->src = src;
  e->dst = dst;
  if (append_p) {
    DLIST_APPEND (in_edge_t, dst->in_edges, e);
    DLIST_APPEND (out_edge_t, src->out_edges, e);
  } else {
    DLIST_PREPEND (in_edge_t, dst->in_edges, e);
    DLIST_PREPEND (out_edge_t, src->out_edges, e);
  }
  e->fall_through_p = fall_through_p;
  e->back_edge_p = e->flag1 = e->flag2 = FALSE;
  return e;
}